

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t pmevtyper_readfn(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint64_t uVar1;
  uint8_t in_DL;
  
  uVar1 = pmevtyper_read(env,(ARMCPRegInfo_conflict *)
                             (ulong)(byte)(ri->opc2 & 7 | (ri->crm & 3) << 3),in_DL);
  return uVar1;
}

Assistant:

static uint64_t pmevtyper_readfn(CPUARMState *env, const ARMCPRegInfo *ri)
{
    uint8_t counter = ((ri->crm & 3) << 3) | (ri->opc2 & 7);
    return pmevtyper_read(env, ri, counter);
}